

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall sptk::reaper::EpochTracker::CreatePeriodLattice(EpochTracker *this)

{
  float fVar1;
  float fVar2;
  short sVar3;
  int iVar4;
  pointer pfVar5;
  long *plVar6;
  int *piVar7;
  pointer ppEVar8;
  vector<float,_std::allocator<float>_> *this_00;
  int iVar9;
  long lVar10;
  pointer pRVar11;
  ulong uVar12;
  uint uVar13;
  size_t pp;
  long lVar14;
  int iVar15;
  size_t pcand;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  int32_t iVar19;
  size_t cc_peak_ind;
  ulong uVar20;
  float fVar21;
  float fVar22;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float local_b0;
  EpochCand *uv_cand;
  EpochCand *v_cand;
  float local_98;
  int local_94;
  int local_90;
  int local_8c;
  float best_cc_val;
  float time;
  long local_80;
  ulong local_78;
  long local_70;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  vector<float,_std::allocator<float>_> *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = (ulong)(uint)(int)(this->sample_rate_ / this->max_f0_search_ + 0.5);
  local_50 = (ulong)(uint)(int)(this->sample_rate_ / this->min_f0_search_ + 0.5);
  local_58 = &this->best_corr_;
  uVar20 = 0;
  do {
    uVar16 = uVar20;
    this_00 = local_58;
    pRVar11 = (this->resid_peaks_).
              super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->resid_peaks_).
                       super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar11) / 0x70) <= uVar16
       ) {
      return;
    }
    uVar13 = pRVar11[uVar16].resid_index;
    local_38 = (ulong)(int)uVar13;
    if ((long)local_38 < 0) {
      fVar21 = (float)((ulong)(uVar13 & 1) | local_38 >> 1);
      fVar21 = fVar21 + fVar21;
    }
    else {
      fVar21 = (float)(int)uVar13;
    }
    local_80 = (long)pRVar11[uVar16].frame_index;
    local_8c = (int)local_48 + uVar13;
    local_94 = (int)local_50 + uVar13;
    time = fVar21 / this->sample_rate_;
    sVar3 = **(short **)
              &pRVar11[uVar16].nccf_periods.super__Vector_base<short,_std::allocator<short>_>.
               _M_impl;
    best_cc_val = *(float *)(*(long *)&pRVar11[uVar16].nccf.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl +
                            ((long)sVar3 - (long)this->first_nccf_lag_) * 4);
    std::vector<float,_std::allocator<float>_>::push_back(local_58,&time);
    std::vector<float,_std::allocator<float>_>::push_back(this_00,&best_cc_val);
    uv_cand = (EpochCand *)operator_new(0x20);
    uv_cand->voiced = false;
    iVar19 = (int32_t)uVar16;
    uv_cand->start_peak = iVar19;
    uv_cand->local_cost = 0.0;
    uv_cand->cost_sum = 0.0;
    uv_cand->best_prev_cand = -1;
    local_98 = (float)(int)sVar3;
    pRVar11 = (this->resid_peaks_).
              super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = 0;
    local_b0 = 1e+30;
    uVar20 = uVar16 + 1;
    local_40 = uVar20;
    for (; uVar20 < (ulong)(((long)(this->resid_peaks_).
                                   super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar11) /
                           0x70); uVar20 = uVar20 + 1) {
      local_70 = uVar20 * 0x70;
      if (local_8c <= pRVar11[uVar20].resid_index) {
        iVar15 = pRVar11[uVar20].resid_index - (int)local_38;
        fVar21 = (float)iVar15;
        local_90 = iVar9;
        local_78 = uVar20;
        local_68 = logf(fVar21 / local_98);
        local_68 = ABS(local_68);
        uVar12 = 0;
        uVar20 = 1;
        uStack_64 = extraout_XMM0_Db;
        uStack_60 = extraout_XMM0_Dc;
        uStack_5c = extraout_XMM0_Dd;
        while( true ) {
          uStack_5c = uStack_5c & 0x7fffffff;
          uStack_60 = uStack_60 & 0x7fffffff;
          uStack_64 = uStack_64 & 0x7fffffff;
          pRVar11 = (this->resid_peaks_).
                    super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar10 = *(long *)&pRVar11[uVar16].nccf_periods.
                             super__Vector_base<short,_std::allocator<short>_>._M_impl;
          if ((ulong)((long)*(pointer *)
                             ((long)&pRVar11[uVar16].nccf_periods.
                                     super__Vector_base<short,_std::allocator<short>_>._M_impl + 8)
                      - lVar10 >> 1) <= uVar20) break;
          fVar22 = logf(fVar21 / (float)(int)*(short *)(lVar10 + uVar20 * 2));
          if (ABS(fVar22) < local_68) {
            uVar12 = uVar20 & 0xffffffff;
            local_68 = ABS(fVar22);
          }
          uVar20 = uVar20 + 1;
          uStack_64 = extraout_XMM0_Db_00;
          uStack_60 = extraout_XMM0_Dc_00;
          uStack_5c = extraout_XMM0_Dd_00;
        }
        v_cand = (EpochCand *)operator_new(0x20);
        uVar20 = local_78;
        v_cand->voiced = true;
        v_cand->period = iVar15;
        uVar13 = iVar15 - this->first_nccf_lag_;
        lVar10 = (long)(int)uVar12;
        if (((int)uVar13 < 0) || (this->n_nccf_lags_ <= (int)uVar13)) {
          lVar14 = *(long *)&pRVar11[uVar16].nccf_periods.
                             super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data;
          pfVar18 = (float *)(((long)*(short *)(lVar14 + lVar10 * 2) - (long)this->first_nccf_lag_)
                              * 4 + *(long *)&pRVar11[uVar16].nccf.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
        }
        else {
          pfVar18 = (float *)((ulong)uVar13 * 4 +
                             *(long *)&pRVar11[uVar16].nccf.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data);
          lVar14 = *(long *)&pRVar11[uVar16].nccf_periods.
                             super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data;
        }
        fVar22 = this->level_wt_;
        pfVar5 = (this->prob_voiced_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = *pfVar18;
        fVar2 = this->reward_;
        fVar21 = fVar2 + fVar21 * this->period_wt_ +
                         (1.0 - pfVar5[local_80]) * fVar22 +
                         this->peak_quality_wt_ /
                         (*(float *)((long)&pRVar11->peak_quality + local_70) +
                         pRVar11[uVar16].peak_quality) +
                         local_68 * this->period_deviation_wt_ + (1.0 - fVar1);
        v_cand->local_cost = fVar21;
        if (local_b0 <= fVar21) {
          iVar9 = (int)*(short *)(lVar14 + lVar10 * 2);
        }
        else {
          uv_cand->period = iVar15;
          uv_cand->local_cost =
               fVar2 + fVar1 * this->nccf_uv_peak_wt_ + fVar22 * pfVar5[local_80] +
                       this->unvoiced_cost_;
          uv_cand->end_peak = (int32_t)local_78;
          iVar9 = (int)*(short *)(lVar14 + lVar10 * 2);
          uv_cand->closest_nccf_period = iVar9;
          local_b0 = fVar21;
        }
        v_cand->start_peak = iVar19;
        v_cand->end_peak = (int32_t)local_78;
        v_cand->closest_nccf_period = iVar9;
        v_cand->cost_sum = 0.0;
        v_cand->best_prev_cand = -1;
        std::
        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ::push_back(&pRVar11[uVar16].future,&v_cand);
        lVar10 = local_70;
        std::
        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                     *)((long)&(((this->resid_peaks_).
                                 super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->past).
                               super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                               ._M_impl + local_70),&v_cand);
        iVar9 = local_90 + 1;
        pRVar11 = (this->resid_peaks_).
                  super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_94 <= *(int *)((long)&pRVar11->resid_index + lVar10)) break;
      }
    }
    if (iVar9 == 0) {
      operator_delete(uv_cand);
    }
    else {
      std::
      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ::push_back(&pRVar11[uVar16].future,&uv_cand);
      std::
      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ::push_back(&(this->resid_peaks_).
                   super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                   ._M_impl.super__Vector_impl_data._M_start[uv_cand->end_peak].past,&uv_cand);
    }
    pRVar11 = (this->resid_peaks_).
              super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ._M_impl.super__Vector_impl_data._M_start;
    plVar6 = *(long **)&pRVar11[uVar16].past.
                        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                        ._M_impl;
    lVar10 = (long)*(pointer *)
                    ((long)&pRVar11[uVar16].past.
                            super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                            ._M_impl + 8) - (long)plVar6;
    uVar20 = local_40;
    if (lVar10 == 0) {
      lVar10 = *(long *)&pRVar11[uVar16].future.
                         super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                         ._M_impl.super__Vector_impl_data;
      ppEVar8 = *(pointer *)
                 ((long)&pRVar11[uVar16].future.
                         super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                         ._M_impl + 8);
      for (lVar14 = 0; (long)ppEVar8 - lVar10 >> 3 != lVar14; lVar14 = lVar14 + 1) {
        lVar17 = *(long *)(lVar10 + lVar14 * 8);
        *(undefined4 *)(lVar17 + 8) = *(undefined4 *)(lVar17 + 4);
        *(undefined4 *)(lVar17 + 0x14) = 0xffffffff;
      }
    }
    else {
      fVar21 = *(float *)(*plVar6 + 4);
      iVar9 = 0;
      lVar14 = 0;
      for (lVar17 = 0; lVar10 >> 3 != lVar17; lVar17 = lVar17 + 1) {
        if (*(char *)(plVar6[lVar17] + 0x1c) == '\0') {
          iVar9 = iVar9 + 1;
        }
        else {
          fVar22 = *(float *)(plVar6[lVar17] + 4);
          if (fVar22 < fVar21) {
            lVar14 = lVar17;
            fVar21 = fVar22;
          }
        }
      }
      if (iVar9 == 0) {
        iVar9 = *(int *)(plVar6[lVar14] + 0xc);
        v_cand = (EpochCand *)operator_new(0x20);
        v_cand->voiced = false;
        v_cand->start_peak = iVar9;
        v_cand->end_peak = iVar19;
        piVar7 = *(int **)(*(long *)&pRVar11[uVar16].past.
                                     super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                     ._M_impl.super__Vector_impl_data + lVar14 * 8);
        iVar15 = *piVar7;
        v_cand->period = iVar15;
        iVar4 = piVar7[6];
        v_cand->closest_nccf_period = iVar4;
        v_cand->local_cost = 0.0;
        v_cand->cost_sum = 0.0;
        v_cand->best_prev_cand = -1;
        uVar13 = iVar15 - this->first_nccf_lag_;
        uVar12 = (ulong)(iVar4 - this->first_nccf_lag_);
        uVar20 = (ulong)uVar13;
        if (this->n_nccf_lags_ <= (int)uVar13) {
          uVar20 = uVar12;
        }
        if ((int)uVar13 < 0) {
          uVar20 = uVar12;
        }
        v_cand->local_cost =
             this->nccf_uv_peak_wt_ *
             *(float *)(*(long *)&pRVar11[iVar9].nccf.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data + uVar20 * 4) +
             this->level_wt_ *
             (this->prob_voiced_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[pRVar11[iVar9].frame_index] + this->unvoiced_cost_ +
             this->reward_;
        std::
        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ::push_back(&pRVar11[iVar9].future,&v_cand);
        std::
        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ::push_back(&(this->resid_peaks_).
                     super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].past,&v_cand);
        uVar20 = local_40;
      }
    }
  } while( true );
}

Assistant:

void EpochTracker::CreatePeriodLattice(void) {
  int32_t low_period = RoundUp(sample_rate_ / max_f0_search_);
  int32_t high_period = RoundUp(sample_rate_ / min_f0_search_);
#if 0
  int32_t total_cands = 0;
#endif

  //  For each pulse in the normalized residual...
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    size_t frame_index = resid_peaks_[peak].frame_index;
    size_t resid_index = resid_peaks_[peak].resid_index;
    int32_t min_period = resid_index + low_period;
    int32_t max_period = resid_index + high_period;
    float lowest_cost = 1.0e30;
    float time = resid_index / sample_rate_;
    int32_t best_nccf_period = resid_peaks_[peak].nccf_periods[0];
    float best_cc_val =
        resid_peaks_[peak].nccf[best_nccf_period - first_nccf_lag_];
    best_corr_.push_back(time);
    best_corr_.push_back(best_cc_val);
    EpochCand* uv_cand = new EpochCand;  // pre-allocate an unvoiced candidate.
    uv_cand->voiced = false;
    uv_cand->start_peak = peak;
    uv_cand->cost_sum = 0.0;
    uv_cand->local_cost = 0.0;
    uv_cand->best_prev_cand = -1;
    int32_t next_cands_created = 0;
    // For each of the next residual pulses in the search range...
    for (size_t npeak = peak + 1; npeak < resid_peaks_.size(); ++npeak) {
      int32_t iperiod = resid_peaks_[npeak].resid_index - resid_index;
      if (resid_peaks_[npeak].resid_index >= min_period) {
        float fperiod = iperiod;
        // Find the NCCF period that most closely matches.
        int32_t cc_peak = 0;
        float min_period_diff = fabs(log(fperiod / best_nccf_period));
        for (size_t cc_peak_ind = 1;
             cc_peak_ind < resid_peaks_[peak].nccf_periods.size();
             ++cc_peak_ind) {
          int32_t nccf_period =  resid_peaks_[peak].nccf_periods[cc_peak_ind];
          float test_diff = fabs(log(fperiod / nccf_period));
          if (test_diff < min_period_diff) {
            min_period_diff = test_diff;
            cc_peak = cc_peak_ind;
          }
        }
        // Generate a forward-period candidate.  Grade the candidate
        // on closeness to a NCCF period hyp, value of the NCCF,
        // values of the candidate endpoint peaks.
        EpochCand* v_cand = new EpochCand;
        v_cand->voiced = true;
        v_cand->period = iperiod;
        int32_t cc_index = iperiod - first_nccf_lag_;
        float cc_value = 0.0;
        // If this period is in the normal search range, retrieve the
        // actual NCCF value for that lag.
        if ((cc_index >= 0) && (cc_index < n_nccf_lags_)) {
          cc_value = resid_peaks_[peak].nccf[cc_index];
        } else {  // punt and use the "closest" nccf peak
          int32_t peak_cc_index = resid_peaks_[peak].nccf_periods[cc_peak] -
              first_nccf_lag_;
          cc_value =  resid_peaks_[peak].nccf[peak_cc_index];
        }
        float per_dev_cost = period_deviation_wt_ * min_period_diff;
        float level_cost = level_wt_ * (1.0 - prob_voiced_[frame_index]);
        float period_cost = fperiod * period_wt_;
        float peak_qual_cost = peak_quality_wt_ /
            (resid_peaks_[npeak].peak_quality + resid_peaks_[peak].peak_quality);
        float local_cost =  (1.0 - cc_value) + per_dev_cost + peak_qual_cost +
            level_cost + period_cost + reward_;
        v_cand->local_cost = local_cost;
        if (local_cost < lowest_cost) {
          lowest_cost = local_cost;
          // Evaluate this best voiced period as an unvoiced
          // hypothesis.  (There are always plenty of poor
          // voiced candidates!)
          uv_cand->period = iperiod;
          level_cost = level_wt_ * prob_voiced_[frame_index];
          uv_cand->local_cost = (nccf_uv_peak_wt_ * cc_value) +
              level_cost + unvoiced_cost_ + reward_;
          uv_cand->end_peak = npeak;
          uv_cand->closest_nccf_period =
              resid_peaks_[peak].nccf_periods[cc_peak];
        }
        v_cand->start_peak = peak;
        v_cand->end_peak = npeak;
        v_cand->closest_nccf_period = resid_peaks_[peak].nccf_periods[cc_peak];
        v_cand->cost_sum = 0.0;
        v_cand->best_prev_cand = -1;
        resid_peaks_[peak].future.push_back(v_cand);
        resid_peaks_[npeak].past.push_back(v_cand);
#if 0
        total_cands++;
#endif
        next_cands_created++;
        if (resid_peaks_[npeak].resid_index >= max_period) {
          break;  // Exit the search only after at least one peak has
          // been found, even if it is necessary to go beyond
          // the nominal maximum period.
        }
      }  // end if this period is >= minimum search period.
    }  // end for each next pulse in the global period-search range.
    // Install the unvoiced candidate for this pulse.
    if (next_cands_created) {  // Register the unvoiced hyp iff there
      // was at least one voiced hyp.
      resid_peaks_[peak].future.push_back(uv_cand);
      resid_peaks_[uv_cand->end_peak].past.push_back(uv_cand);
#if 0
      total_cands++;
#endif
    } else {
      delete uv_cand;
    }
    // Now all residual-pulse period hyps that start at the current
    // pulse have been generated.

    // If this pulse is one of the first few in the residual that had
    // no possible preceeding periods, mark it as an origin.
    if (resid_peaks_[peak].past.size() == 0) {  // Is this pulse an origin?
      for (size_t pp = 0; pp < resid_peaks_[peak].future.size(); ++pp) {
        resid_peaks_[peak].future[pp]->cost_sum =
            resid_peaks_[peak].future[pp]->local_cost;
        resid_peaks_[peak].future[pp]->best_prev_cand = -1;
      }
    } else {  // There are previous period hyps to consider...
      // Check if at least one UV hyp is included in the period hyps
      // that end on this peak.  If there are none, generate one by
      // cloning the best voiced hyp in the collection, but score it
      // as unvoiced.
      int32_t uv_hyps_found = 0;
      float lowest_cost =  resid_peaks_[peak].past[0]->local_cost;
      size_t lowest_index = 0;
      for (size_t pcand = 0; pcand < resid_peaks_[peak].past.size(); ++pcand) {
        if (!resid_peaks_[peak].past[pcand]->voiced) {
          uv_hyps_found++;
        } else {
          if (resid_peaks_[peak].past[pcand]->local_cost < lowest_cost) {
            lowest_index = pcand;
            lowest_cost = resid_peaks_[peak].past[pcand]->local_cost;
          }
        }
      }
      if (!uv_hyps_found) {  // clone an UV hyp from the best V hyp found.
        size_t start_peak = resid_peaks_[peak].past[lowest_index]->start_peak;
        EpochCand* uv_cand = new EpochCand;
        uv_cand->voiced = false;
        uv_cand->start_peak = start_peak;
        uv_cand->end_peak = peak;
        uv_cand->period =  resid_peaks_[peak].past[lowest_index]->period;
        uv_cand->closest_nccf_period =
            resid_peaks_[peak].past[lowest_index]->closest_nccf_period;
        uv_cand->cost_sum = 0.0;
        uv_cand->local_cost = 0.0;
        uv_cand->best_prev_cand = -1;
        float llevel_cost = level_wt_ *
            prob_voiced_[resid_peaks_[start_peak].frame_index];
        int32_t lcc_index = uv_cand->period - first_nccf_lag_;
        float lcc_value = 0.0;
        // If this period is in the normal search range, retrieve the
        // actual NCCF value for that lag.
        if ((lcc_index >= 0) && (lcc_index < n_nccf_lags_)) {
          lcc_value = resid_peaks_[start_peak].nccf[lcc_index];
        } else {
          int32_t peak_cc_index = uv_cand->closest_nccf_period - first_nccf_lag_;
          lcc_value =  resid_peaks_[start_peak].nccf[peak_cc_index];
        }
        uv_cand->local_cost = (nccf_uv_peak_wt_ * lcc_value) + llevel_cost +
            unvoiced_cost_ + reward_;
        resid_peaks_[start_peak].future.push_back(uv_cand);
        resid_peaks_[peak].past.push_back(uv_cand);
#if 0
        total_cands++;
#endif
      }
    }
  }  // end of the first pass at all pulses in the residual.
  // All forward period hypotheses that start on all residual pulses
  // in the signal have now been generated, and both voiced and
  // unvoiced continuity throughout the lattice of hyps have been
  // assured.
}